

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_index_list.cpp
# Opt level: O2

void __thiscall duckdb::TableIndexList::RemoveIndex(TableIndexList *this,string *name)

{
  __type _Var1;
  int iVar2;
  reference this_00;
  pointer pIVar3;
  undefined4 extraout_var;
  idx_t i;
  ulong __n;
  
  ::std::mutex::lock(&this->indexes_lock);
  __n = 0;
  do {
    if ((ulong)((long)(this->indexes).
                      super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->indexes).
                      super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) {
LAB_00565b76:
      pthread_mutex_unlock((pthread_mutex_t *)this);
      return;
    }
    this_00 = vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_true>
              ::get<true>(&this->indexes,__n);
    pIVar3 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                       (this_00);
    iVar2 = (*pIVar3->_vptr_Index[4])(pIVar3);
    _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(extraout_var,iVar2),name);
    if (_Var1) {
      vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_true>::
      erase_at(&this->indexes,__n);
      goto LAB_00565b76;
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

void TableIndexList::RemoveIndex(const string &name) {
	lock_guard<mutex> lock(indexes_lock);

	for (idx_t i = 0; i < indexes.size(); i++) {
		auto &index = indexes[i];
		if (index->GetIndexName() == name) {
			indexes.erase_at(i);
			break;
		}
	}
}